

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::AesGcmV1::read(AesGcmV1 *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t uVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_ffffffffffffff68;
  TType in_stack_ffffffffffffff6c;
  uint32_t in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  uint32_t in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  short local_46;
  int local_44;
  string local_40 [36];
  uint local_1c;
  undefined8 local_10;
  AesGcmV1 *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
             ,(TProtocol *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_1c = uVar1 + local_1c;
  while( true ) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (TType *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (int16_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_1c = uVar1 + local_1c;
    if (local_44 == 0) break;
    if (local_46 == 1) {
      if (local_44 == 0xb) {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::readBinary
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        local_1c = uVar1 + local_1c;
        this->__isset = (_AesGcmV1__isset)((byte)this->__isset & 0xfe | 1);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           in_stack_ffffffffffffff6c);
        local_1c = uVar1 + local_1c;
      }
    }
    else if (local_46 == 2) {
      if (local_44 == 0xb) {
        in_stack_ffffffffffffff84 =
             duckdb_apache::thrift::protocol::TProtocol::readBinary
                       ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        local_1c = in_stack_ffffffffffffff84 + local_1c;
        this->__isset = (_AesGcmV1__isset)((byte)this->__isset & 0xfd | 2);
      }
      else {
        in_stack_ffffffffffffff80 =
             duckdb_apache::thrift::protocol::TProtocol::skip
                       ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c);
        local_1c = in_stack_ffffffffffffff80 + local_1c;
      }
    }
    else if (local_46 == 3) {
      if (local_44 == 2) {
        in_stack_ffffffffffffff7c =
             duckdb_apache::thrift::protocol::TProtocol::readBool
                       ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (bool *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        local_1c = in_stack_ffffffffffffff7c + local_1c;
        this->__isset = (_AesGcmV1__isset)((byte)this->__isset & 0xfb | 4);
      }
      else {
        in_stack_ffffffffffffff78 =
             duckdb_apache::thrift::protocol::TProtocol::skip
                       ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c);
        local_1c = in_stack_ffffffffffffff78 + local_1c;
      }
    }
    else {
      in_stack_ffffffffffffff74 =
           duckdb_apache::thrift::protocol::TProtocol::skip
                     ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6c);
      local_1c = in_stack_ffffffffffffff74 + local_1c;
    }
    in_stack_ffffffffffffff70 =
         duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x2260c42);
    local_1c = in_stack_ffffffffffffff70 + local_1c;
  }
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x2260c66);
  uVar2 = uVar1 + local_1c;
  local_1c = uVar2;
  std::__cxx11::string::~string(local_40);
  duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
            ((TInputRecursionTracker *)0x2260c96);
  return (ulong)uVar2;
}

Assistant:

uint32_t AesGcmV1::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->aad_prefix);
          this->__isset.aad_prefix = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->aad_file_unique);
          this->__isset.aad_file_unique = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->supply_aad_prefix);
          this->__isset.supply_aad_prefix = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}